

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

int lj_debug_getinfo(lua_State *L,char *what,lj_Debug *ar,int ext)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  BCLine BVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  GCtab *t;
  TValue *pTVar9;
  uint32_t uVar10;
  GCfunc *fn;
  long lVar11;
  ulong uVar12;
  char cVar13;
  cTValue *frame;
  ulong uVar14;
  cTValue *local_48;
  
  if (*what == '>') {
    pTVar9 = L->top;
    if (*(int *)((long)pTVar9 + -4) != -9) {
      return 0;
    }
    uVar7 = pTVar9[-1].u32.lo;
    L->top = pTVar9 + -1;
    what = what + 1;
    local_48 = (cTValue *)0x0;
    frame = (cTValue *)0x0;
  }
  else {
    uVar7 = ar->i_ci;
    frame = (cTValue *)((ulong)(L->stack).ptr32 + (ulong)(uVar7 & 0xffff) * 8);
    local_48 = (cTValue *)0x0;
    if (0xffff < uVar7) {
      local_48 = frame + (uVar7 >> 0x10);
    }
    uVar7 = (frame->u32).lo;
  }
  fn = (GCfunc *)(ulong)uVar7;
  bVar4 = false;
  bVar3 = false;
  do {
    cVar13 = *what;
    if (cVar13 == 'L') {
      bVar4 = true;
    }
    else if (cVar13 == 'S') {
      if ((fn->c).ffid == '\0') {
        uVar14 = (ulong)(fn->c).pc.ptr32;
        uVar1 = *(uint *)(uVar14 - 0x18);
        iVar6 = *(int *)(uVar14 - 0x14);
        ar->source = (char *)((GCstr *)(ulong)uVar1 + 1);
        lj_debug_shortname(ar->short_src,(GCstr *)(ulong)uVar1,iVar6);
        ar->linedefined = iVar6;
        iVar2 = *(int *)(uVar14 - 0x10);
        ar->lastlinedefined = iVar2 + iVar6;
        pcVar8 = "main";
        if (iVar2 == 0) {
          pcVar8 = "Lua";
        }
        if (iVar6 != 0) {
          pcVar8 = "Lua";
        }
      }
      else {
        ar->source = "=[C]";
        builtin_strncpy(ar->short_src,"[C]",4);
        ar->linedefined = -1;
        ar->lastlinedefined = -1;
        pcVar8 = "C";
      }
      ar->what = pcVar8;
    }
    else if (cVar13 == 'f') {
      bVar3 = true;
    }
    else if (cVar13 == 'l') {
      BVar5 = -1;
      if (frame != (cTValue *)0x0) {
        BVar5 = lj_debug_frameline(L,fn,local_48);
      }
      ar->currentline = BVar5;
    }
    else if (cVar13 == 'n') {
      if (frame != (cTValue *)0x0) {
        pcVar8 = lj_debug_funcname(L,frame,&ar->name);
        ar->namewhat = pcVar8;
        if (pcVar8 != (char *)0x0) goto LAB_00111596;
      }
      ar->namewhat = "";
      ar->name = (char *)0x0;
    }
    else {
      if (cVar13 != 'u') {
        if (cVar13 == '\0') {
          if (bVar3) {
            pTVar9 = L->top;
            (pTVar9->u32).lo = uVar7;
            (pTVar9->field_2).it = 0xfffffff7;
            pTVar9 = L->top;
            L->top = pTVar9 + 1;
            if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar9 + 1) {
              lj_state_growstack1(L);
            }
          }
          iVar6 = 1;
          if (bVar4) {
            if ((fn->c).ffid == '\0') {
              t = lj_tab_new(L,0,0);
              uVar14 = (ulong)(fn->c).pc.ptr32;
              uVar12 = (ulong)*(uint *)(uVar14 - 0xc);
              if (uVar12 != 0) {
                iVar6 = *(int *)(uVar14 - 0x14);
                iVar2 = *(int *)(uVar14 - 0x38);
                cVar13 = '\x01';
                if (0xff < *(int *)(uVar14 - 0x10)) {
                  cVar13 = (0xffff < *(int *)(uVar14 - 0x10)) * '\x02' + '\x02';
                }
                for (uVar14 = 0; iVar2 - 1 != uVar14; uVar14 = uVar14 + 1) {
                  if (cVar13 == '\x02') {
                    uVar7 = (uint)*(ushort *)(uVar12 + uVar14 * 2);
                  }
                  else if (cVar13 == '\x01') {
                    uVar7 = (uint)*(byte *)(uVar12 + uVar14);
                  }
                  else {
                    uVar7 = *(uint *)(uVar12 + uVar14 * 4);
                  }
                  lVar11 = (long)(int)uVar7 + (long)iVar6;
                  uVar7 = (uint)lVar11;
                  if (uVar7 < t->asize) {
                    pTVar9 = (TValue *)((ulong)(t->array).ptr32 + lVar11 * 8);
                  }
                  else {
                    pTVar9 = lj_tab_setinth(L,t,uVar7);
                  }
                  (pTVar9->field_2).it = 0xfffffffd;
                }
              }
              pTVar9 = L->top;
              (pTVar9->u32).lo = (uint32_t)t;
              uVar10 = 0xfffffff4;
            }
            else {
              pTVar9 = L->top;
              uVar10 = 0xffffffff;
            }
            iVar6 = 1;
            (pTVar9->field_2).it = uVar10;
            pTVar9 = L->top;
            L->top = pTVar9 + 1;
            if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar9 + 1) {
              lj_state_growstack1(L);
            }
          }
        }
        else {
          iVar6 = 0;
        }
        return iVar6;
      }
      ar->nups = (uint)(fn->c).nupvalues;
      if (ext != 0) {
        if ((fn->c).ffid == '\0') {
          uVar14 = (ulong)(fn->c).pc.ptr32;
          ar->nparams = (uint)*(byte *)(uVar14 - 0x3a);
          ar->isvararg = *(byte *)(uVar14 - 0x1b) >> 1 & 1;
        }
        else {
          ar->nparams = 0;
          ar->isvararg = 1;
        }
      }
    }
LAB_00111596:
    what = what + 1;
  } while( true );
}

Assistant:

int lj_debug_getinfo(lua_State *L, const char *what, lj_Debug *ar, int ext)
{
  int opt_f = 0, opt_L = 0;
  TValue *frame = NULL;
  TValue *nextframe = NULL;
  GCfunc *fn;
  if (*what == '>') {
    TValue *func = L->top - 1;
    if (!tvisfunc(func)) return 0;
    fn = funcV(func);
    L->top--;
    what++;
  } else {
    uint32_t offset = (uint32_t)ar->i_ci & 0xffff;
    uint32_t size = (uint32_t)ar->i_ci >> 16;
    lj_assertL(offset != 0, "bad frame offset");
    frame = tvref(L->stack) + offset;
    if (size) nextframe = frame + size;
    lj_assertL(frame <= tvref(L->maxstack) &&
	       (!nextframe || nextframe <= tvref(L->maxstack)),
	       "broken frame chain");
    fn = frame_func(frame);
    lj_assertL(fn->c.gct == ~LJ_TFUNC, "bad frame function");
  }
  for (; *what; what++) {
    if (*what == 'S') {
      if (isluafunc(fn)) {
	GCproto *pt = funcproto(fn);
	BCLine firstline = pt->firstline;
	GCstr *name = proto_chunkname(pt);
	ar->source = strdata(name);
	lj_debug_shortname(ar->short_src, name, pt->firstline);
	ar->linedefined = (int)firstline;
	ar->lastlinedefined = (int)(firstline + pt->numline);
	ar->what = (firstline || !pt->numline) ? "Lua" : "main";
      } else {
	ar->source = "=[C]";
	ar->short_src[0] = '[';
	ar->short_src[1] = 'C';
	ar->short_src[2] = ']';
	ar->short_src[3] = '\0';
	ar->linedefined = -1;
	ar->lastlinedefined = -1;
	ar->what = "C";
      }
    } else if (*what == 'l') {
      ar->currentline = frame ? lj_debug_frameline(L, fn, nextframe) : -1;
    } else if (*what == 'u') {
      ar->nups = fn->c.nupvalues;
      if (ext) {
	if (isluafunc(fn)) {
	  GCproto *pt = funcproto(fn);
	  ar->nparams = pt->numparams;
	  ar->isvararg = !!(pt->flags & PROTO_VARARG);
	} else {
	  ar->nparams = 0;
	  ar->isvararg = 1;
	}
      }
    } else if (*what == 'n') {
      ar->namewhat = frame ? lj_debug_funcname(L, frame, &ar->name) : NULL;
      if (ar->namewhat == NULL) {
	ar->namewhat = "";
	ar->name = NULL;
      }
    } else if (*what == 'f') {
      opt_f = 1;
    } else if (*what == 'L') {
      opt_L = 1;
    } else {
      return 0;  /* Bad option. */
    }
  }
  if (opt_f) {
    setfuncV(L, L->top, fn);
    incr_top(L);
  }
  if (opt_L) {
    if (isluafunc(fn)) {
      GCtab *t = lj_tab_new(L, 0, 0);
      GCproto *pt = funcproto(fn);
      const void *lineinfo = proto_lineinfo(pt);
      if (lineinfo) {
	BCLine first = pt->firstline;
	int sz = pt->numline < 256 ? 1 : pt->numline < 65536 ? 2 : 4;
	MSize i, szl = pt->sizebc-1;
	for (i = 0; i < szl; i++) {
	  BCLine line = first +
	    (sz == 1 ? (BCLine)((const uint8_t *)lineinfo)[i] :
	     sz == 2 ? (BCLine)((const uint16_t *)lineinfo)[i] :
	     (BCLine)((const uint32_t *)lineinfo)[i]);
	  setboolV(lj_tab_setint(L, t, line), 1);
	}
      }
      settabV(L, L->top, t);
    } else {
      setnilV(L->top);
    }
    incr_top(L);
  }
  return 1;  /* Ok. */
}